

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall
args::NargsValueFlag<int,_args::detail::vector,_args::ValueReader>::Match
          (NargsValueFlag<int,_args::detail::vector,_args::ValueReader> *this,EitherFlag *arg)

{
  uint uVar1;
  FlagBase *pFVar2;
  FlagBase *me;
  bool wasMatched;
  EitherFlag *arg_local;
  NargsValueFlag<int,_args::detail::vector,_args::ValueReader> *this_local;
  
  uVar1 = (*(this->super_FlagBase).super_NamedBase.super_Base._vptr_Base[2])();
  pFVar2 = FlagBase::Match(&this->super_FlagBase,arg);
  if ((pFVar2 != (FlagBase *)0x0) && ((uVar1 & 1) == 0)) {
    std::vector<int,_std::allocator<int>_>::clear(&this->values);
  }
  return pFVar2;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &arg) override
            {
                const bool wasMatched = Matched();
                auto me = FlagBase::Match(arg);
                if (me && !wasMatched)
                {
                    values.clear();
                }
                return me;
            }